

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O3

void __thiscall btSliderConstraint::testLinLimits(btSliderConstraint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  this->m_solveLinLim = false;
  fVar1 = (this->m_depth).m_floats[0];
  this->m_linPos = fVar1;
  fVar2 = this->m_lowerLinLimit;
  fVar3 = this->m_upperLinLimit;
  if ((fVar2 <= fVar3) && ((fVar3 < fVar1 || (fVar3 = fVar2, fVar1 < fVar2)))) {
    (this->m_depth).m_floats[0] = fVar1 - fVar3;
    this->m_solveLinLim = true;
    return;
  }
  (this->m_depth).m_floats[0] = 0.0;
  return;
}

Assistant:

void btSliderConstraint::testLinLimits(void)
{
	m_solveLinLim = false;
	m_linPos = m_depth[0];
	if(m_lowerLinLimit <= m_upperLinLimit)
	{
		if(m_depth[0] > m_upperLinLimit)
		{
			m_depth[0] -= m_upperLinLimit;
			m_solveLinLim = true;
		}
		else if(m_depth[0] < m_lowerLinLimit)
		{
			m_depth[0] -= m_lowerLinLimit;
			m_solveLinLim = true;
		}
		else
		{
			m_depth[0] = btScalar(0.);
		}
	}
	else
	{
		m_depth[0] = btScalar(0.);
	}
}